

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O1

void __thiscall
kj::
CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++:411:9),_kj::Array<capnp::PipelineOp>_>
::~CaptureByMove(CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:411:9),_kj::Array<capnp::PipelineOp>_>
                 *this)

{
  PipelineOp *pPVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  pPVar1 = (this->param).ptr;
  if (pPVar1 != (PipelineOp *)0x0) {
    sVar2 = (this->param).size_;
    (this->param).ptr = (PipelineOp *)0x0;
    (this->param).size_ = 0;
    pAVar3 = (this->param).disposer;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,pPVar1,8,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline CaptureByMove(Func&& func, MovedParam&& param)
      : func(kj::mv(func)), param(kj::mv(param)) {}